

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrioExecution.h
# Opt level: O0

void nrg::PrioExecution::
     push<void(*)(nrg::AsyncResult<int>,nrg::AsyncResult<int>,nrg::AsyncResult<int>,int),nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,int>
               (Queue *queue,_func_void_AsyncResult<int>_AsyncResult<int>_AsyncResult<int>_int *fn,
               AsyncResult<int> *param,AsyncResult<int> *param_4,AsyncResult<int> *param_5,
               int *param_6)

{
  QueueElement local_d8;
  undefined1 local_a0 [40];
  AsyncResult<int> local_78;
  undefined4 local_68;
  undefined1 local_60 [8];
  QueueElement elem;
  int *param_local_3;
  AsyncResult<int> *param_local_2;
  AsyncResult<int> *param_local_1;
  AsyncResult<int> *param_local;
  _func_void_AsyncResult<int>_AsyncResult<int>_AsyncResult<int>_int *fn_local;
  Queue *queue_local;
  
  local_60._0_4_ = 0;
  elem.what._M_invoker = (_Invoker_type)param_6;
  local_60._4_4_ = next();
  local_a0._0_8_ = fn;
  AsyncResult<int>::AsyncResult((AsyncResult<int> *)(local_a0 + 8),param);
  AsyncResult<int>::AsyncResult((AsyncResult<int> *)(local_a0 + 0x18),param_4);
  AsyncResult<int>::AsyncResult(&local_78,param_5);
  local_68 = *(undefined4 *)elem.what._M_invoker;
  std::function<void()>::
  function<nrg::PrioExecution::push<void(*)(nrg::AsyncResult<int>,nrg::AsyncResult<int>,nrg::AsyncResult<int>,int),nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,int>(std::priority_queue<nrg::PrioExecution::QueueElement,std::vector<nrg::PrioExecution::QueueElement,std::allocator<nrg::PrioExecution::QueueElement>>,std::greater<nrg::PrioExecution::QueueElement>>&,void(*)(nrg::AsyncResult<int>,nrg::AsyncResult<int>,nrg::AsyncResult<int>,int),nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,int&&)::_lambda()_1_,void>
            ((function<void()> *)&elem,(anon_class_64_5_11abe806 *)local_a0);
  push<void(*)(nrg::AsyncResult<int>,nrg::AsyncResult<int>,nrg::AsyncResult<int>,int),nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,int>(std::priority_queue<nrg::PrioExecution::QueueElement,std::vector<nrg::PrioExecution::QueueElement,std::allocator<nrg::PrioExecution::QueueElement>>,std::greater<nrg::PrioExecution::QueueElement>>&,void(*)(nrg::AsyncResult<int>,nrg::AsyncResult<int>,nrg::AsyncResult<int>,int),nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,int&&)
  ::{lambda()#1}::~priority_queue((_lambda___1_ *)local_a0);
  QueueElement::QueueElement(&local_d8,(QueueElement *)local_60);
  push(queue,&local_d8);
  QueueElement::~QueueElement(&local_d8);
  QueueElement::~QueueElement((QueueElement *)local_60);
  return;
}

Assistant:

static void push(Queue& queue, FN fn, Param&&... param)
    {
        QueueElement elem = { 0, next(), [=]() { fn(param...); } };
        push(queue, std::move(elem));
    }